

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::DragScalarN(char *label,ImGuiDataType data_type,void *p_data,int components,
                       float v_speed,void *p_min,void *p_max,char *format,float power)

{
  bool bVar1;
  ImGuiSliderFlags flags;
  
  if ((power != 1.0) || (NAN(power))) {
    if ((power != 1.0) || (NAN(power))) {
      __assert_fail("power == 1.0f && \"Call function with ImGuiSliderFlags_Logarithmic flags instead of using the old \'float power\' function!\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui_widgets.cpp"
                    ,0x9f6,
                    "bool ImGui::DragScalarN(const char *, ImGuiDataType, void *, int, float, const void *, const void *, const char *, float)"
                   );
    }
    if ((p_min == (void *)0x0) || (flags = 0x20, p_max == (void *)0x0)) {
      __assert_fail("p_min != __null && p_max != __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui_widgets.cpp"
                    ,0x9f7,
                    "bool ImGui::DragScalarN(const char *, ImGuiDataType, void *, int, float, const void *, const void *, const char *, float)"
                   );
    }
  }
  else {
    flags = 0;
  }
  bVar1 = DragScalarN(label,data_type,p_data,components,v_speed,p_min,p_max,format,flags);
  return bVar1;
}

Assistant:

bool ImGui::DragScalarN(const char* label, ImGuiDataType data_type, void* p_data, int components, float v_speed, const void* p_min, const void* p_max, const char* format, float power)
{
    ImGuiSliderFlags drag_flags = ImGuiSliderFlags_None;
    if (power != 1.0f)
    {
        IM_ASSERT(power == 1.0f && "Call function with ImGuiSliderFlags_Logarithmic flags instead of using the old 'float power' function!");
        IM_ASSERT(p_min != NULL && p_max != NULL);  // When using a power curve the drag needs to have known bounds
        drag_flags |= ImGuiSliderFlags_Logarithmic;   // Fallback for non-asserting paths
    }
    return DragScalarN(label, data_type, p_data, components, v_speed, p_min, p_max, format, drag_flags);
}